

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_utils.c
# Opt level: O0

time_t mk_utils_gmt2utime(char *date)

{
  char *pcVar1;
  undefined1 local_58 [8];
  tm t_data;
  time_t new_unix_time;
  char *date_local;
  
  memset(local_58,0,0x38);
  pcVar1 = strptime(date,"%a, %d %b %Y %H:%M:%S GMT",(tm *)local_58);
  if (pcVar1 == (char *)0x0) {
    date_local = (char *)0xffffffffffffffff;
  }
  else {
    date_local = (char *)timegm((tm *)local_58);
  }
  return (time_t)date_local;
}

Assistant:

time_t mk_utils_gmt2utime(char *date)
{
    time_t new_unix_time;
    struct tm t_data;
    memset(&t_data, 0, sizeof(struct tm));


#ifdef _WIN32
#pragma message("Since there is no strptime in windows we'll parse the date in a really crude way just to get it out of the way")

    if (0 != strcmp(MK_UTILS_GMT_DATEFORMAT, "%a, %d %b %Y %H:%M:%S GMT")) {
        return -1;
    }
    
    {
        char *token;

        token = strtok(date, " "); /* "%a, " */

        if (NULL == token) {
            return -1;
        }

        token = strtok(NULL, " "); /* "%d " */

        if (NULL == token) {
            return -1;
        }

        t_data.tm_mday = strtol(token, NULL, 10);

        token = strtok(NULL, " "); /* "%b " */

        if (NULL == token) {
            return -1;
        }

        if(0 == _strnicmp(token, "jan", 3)){
            t_data.tm_mon = 0;
        }
        else if(0 == _strnicmp(token, "feb", 3)){
            t_data.tm_mon = 1;
        }
        else if(0 == _strnicmp(token, "mar", 3)){
            t_data.tm_mon = 2;
        }
        else if(0 == _strnicmp(token, "apr", 3)){
            t_data.tm_mon = 3;
        }
        else if(0 == _strnicmp(token, "may", 3)){
            t_data.tm_mon = 4;
        }
        else if(0 == _strnicmp(token, "jun", 3)){
            t_data.tm_mon = 5;
        }
        else if(0 == _strnicmp(token, "jul", 3)){
            t_data.tm_mon = 6;
        }
        else if(0 == _strnicmp(token, "aug", 3)){
            t_data.tm_mon = 7;
        }
        else if(0 == _strnicmp(token, "sep", 3)){
            t_data.tm_mon = 8;
        }
        else if(0 == _strnicmp(token, "oct", 3)){
            t_data.tm_mon = 9;
        }
        else if(0 == _strnicmp(token, "nov", 3)){
            t_data.tm_mon = 10;
        }
        else if(0 == _strnicmp(token, "dec", 3)){
            t_data.tm_mon = 11;
        }
        else {
            return -1;
        }

        token = strtok(NULL, " "); /* "%Y " */

        if (NULL == token) {
            return -1;
        }

        t_data.tm_year = strtol(token, NULL, 10);

        token = strtok(NULL, ":"); /* "%H:" */

        if (NULL == token) {
            return -1;
        }

        t_data.tm_hour = strtol(token, NULL, 10);

        token = strtok(NULL, ":"); /* "%M:" */

        if (NULL == token) {
            return -1;
        }

        t_data.tm_min = strtol(token, NULL, 10);

        token = strtok(NULL, " "); /* "%S " */

        if (NULL == token) {
            return -1;
        }

        t_data.tm_sec = strtol(token, NULL, 10);
    }

#else
    if (!strptime(date, MK_UTILS_GMT_DATEFORMAT, (struct tm*)&t_data)) {
        return -1;
    }
#endif

    new_unix_time = timegm((struct tm *) &t_data);

    return (new_unix_time);
}